

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::checkTypeSupportedForExternalEvents(Context *context,Type *t)

{
  Category CVar1;
  Structure *pSVar2;
  char (*in_RDX) [36];
  Member *m;
  Member *t_00;
  long lVar3;
  Type TStack_68;
  CompileMessage local_50;
  
  CVar1 = t->category;
  if ((CVar1 & ~primitive) != wrap) {
    if (CVar1 == array) {
      Type::getArrayElementType(&TStack_68,t);
      checkTypeSupportedForExternalEvents(context,&TStack_68);
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_68.structure);
      CVar1 = t->category;
    }
    if (CVar1 == structure) {
      pSVar2 = Type::getStructRef(t);
      t_00 = (pSVar2->members).items;
      for (lVar3 = (pSVar2->members).numActive << 6; lVar3 != 0; lVar3 = lVar3 + -0x40) {
        checkTypeSupportedForExternalEvents(context,&t_00->type);
        t_00 = t_00 + 1;
      }
    }
    return;
  }
  Errors::notYetImplemented<char_const(&)[36]>
            (&local_50,(Errors *)"Endpoints using wrap or clamp types",in_RDX);
  AST::Context::throwError(context,&local_50,false);
}

Assistant:

static void checkTypeSupportedForExternalEvents (const AST::Context& context, const Type& t)
    {
        if (t.isBoundedInt())
            context.throwError (Errors::notYetImplemented ("Endpoints using wrap or clamp types"));

        if (t.isArray())
            checkTypeSupportedForExternalEvents (context, t.getArrayElementType());

        if (t.isStruct())
            for (auto& m : t.getStructRef().getMembers())
                checkTypeSupportedForExternalEvents (context, m.type);
    }